

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::AssertLoadFactor
          (KeyMapBase<unsigned_long> *this)

{
  uint uVar1;
  
  uVar1 = (this->super_UntypedMapBase).num_buckets_;
  if ((ulong)(this->super_UntypedMapBase).num_elements_ <=
      (ulong)(uVar1 & 0xfffffffe) - (ulong)(uVar1 >> 2 & 0xfffffffc)) {
    return;
  }
  AssertLoadFactor();
}

Assistant:

void AssertLoadFactor() const {
    ABSL_DCHECK_LE(num_elements_, CalculateHiCutoff(num_buckets_));
  }